

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

locale booster::locale::impl_posix::create_formatting
                 (locale *in,shared_ptr<__locale_struct_*> *lc,character_facet_type type)

{
  int in_ECX;
  shared_ptr<__locale_struct_*> *in_RSI;
  _Impl *in_RDI;
  shared_ptr<__locale_struct_*> *in_stack_00000050;
  locale *in_stack_00000058;
  shared_ptr<__locale_struct_*> *in_stack_ffffffffffffff68;
  shared_ptr<__locale_struct_*> *in_stack_ffffffffffffff70;
  
  if (in_ECX == 1) {
    std::shared_ptr<__locale_struct_*>::shared_ptr
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    create_formatting_impl<char>(in_stack_00000058,in_stack_00000050);
    std::shared_ptr<__locale_struct_*>::~shared_ptr((shared_ptr<__locale_struct_*> *)0x286b93);
  }
  else if (in_ECX == 2) {
    std::shared_ptr<__locale_struct_*>::shared_ptr(in_RSI,in_stack_ffffffffffffff68);
    create_formatting_impl<wchar_t>(in_stack_00000058,in_stack_00000050);
    std::shared_ptr<__locale_struct_*>::~shared_ptr((shared_ptr<__locale_struct_*> *)0x286bf3);
  }
  else {
    std::locale::locale((locale *)in_RDI,(locale *)in_RSI);
  }
  return (locale)in_RDI;
}

Assistant:

std::locale create_formatting(  std::locale const &in,
                                booster::shared_ptr<locale_t> lc,
                                character_facet_type type)
{
        switch(type) {
        case char_facet: 
            return create_formatting_impl<char>(in,lc);
        case wchar_t_facet:
            return create_formatting_impl<wchar_t>(in,lc);
        default:
            return in;
        }
}